

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
booster::locale::basic_format<wchar_t>::format_output
          (basic_format<wchar_t> *this,stream_type *out,string_type *sformat)

{
  format_parser *this_00;
  pointer pwVar1;
  bool bVar2;
  wchar_t wVar3;
  uint uVar4;
  code *pcVar5;
  pointer pfVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_type *local_c0;
  string svalue;
  string_type value;
  format_parser fmt;
  undefined1 local_70 [8];
  string key;
  undefined1 local_48 [8];
  format_guard guard;
  
  pwVar1 = (sformat->_M_dataplus)._M_p;
  key.field_2._8_8_ = sformat->_M_string_length;
  uVar8 = 0;
  guard._8_8_ = out;
LAB_0018706d:
  do {
    while( true ) {
      wVar3 = pwVar1[uVar8];
      if (wVar3 != L'{') break;
      uVar9 = uVar8 + 1;
      if (((ulong)key.field_2._8_8_ <= uVar9) || (pwVar1[uVar8 + 1] != L'{')) {
        this_00 = (format_parser *)((long)&value.field_2 + 8);
        booster::locale::details::format_parser::format_parser
                  (this_00,(ios_base *)(*(long *)(*(long *)guard._8_8_ + -0x18) + guard._8_8_),
                   (void *)guard._8_8_,imbue_locale);
        guard.fmt_._0_1_ = '\0';
        local_48 = (undefined1  [8])this_00;
LAB_00187108:
        if (uVar9 < (ulong)key.field_2._8_8_) {
          local_70 = (undefined1  [8])&key._M_string_length;
          key._M_dataplus._M_p = (pointer)0x0;
          key._M_string_length._0_1_ = 0;
          local_c0 = &svalue._M_string_length;
          svalue._M_dataplus._M_p = (pointer)0x0;
          svalue._M_string_length._0_1_ = 0;
          svalue.field_2._8_8_ = &value._M_string_length;
          value._M_dataplus._M_p = (pointer)0x0;
          value._M_string_length._0_4_ = 0;
          do {
            wVar3 = pwVar1[uVar9];
            if (wVar3 < L'=') {
              if ((wVar3 == L'\0') || (wVar3 == L',')) goto LAB_00187218;
            }
            else {
              if (wVar3 == L'=') {
                wVar3 = pwVar1[uVar9 + 1];
                uVar8 = uVar9;
                if (wVar3 != L'\'') goto LAB_001871f1;
                uVar9 = uVar9 + 2;
                goto LAB_001871a3;
              }
              if (wVar3 == L'}') goto LAB_00187218;
            }
            std::__cxx11::string::push_back((char)(string *)local_70);
            uVar9 = uVar9 + 1;
          } while( true );
        }
        goto LAB_0018732d;
      }
      local_70._0_4_ = 0x7b;
LAB_001870c8:
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                ((wostream *)guard._8_8_,(wchar_t *)local_70,1);
      uVar8 = uVar8 + 2;
    }
    if (wVar3 == L'}') {
      if (pwVar1[uVar8 + 1] == L'}') {
        local_70._0_4_ = 0x7d;
        goto LAB_001870c8;
      }
    }
    else if (wVar3 == L'\0') {
      return;
    }
    local_70._0_4_ = wVar3;
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              ((wostream *)guard._8_8_,(wchar_t *)local_70,1);
    uVar8 = uVar8 + 1;
  } while( true );
LAB_001871f1:
  while (((uVar9 = uVar8 + 1, wVar3 != L'\0' && (wVar3 != L',')) && (wVar3 != L'}'))) {
    std::__cxx11::string::push_back((char)&local_c0);
    wVar3 = pwVar1[uVar8 + 2];
    uVar8 = uVar9;
  }
LAB_00187218:
  booster::locale::details::format_parser::set_one_flag
            ((string *)((long)&value.field_2 + 8),(string *)local_70);
LAB_0018722b:
  if (pwVar1[uVar9] == L'}') {
    uVar4 = booster::locale::details::format_parser::get_position();
    if (uVar4 < this->parameters_count_) {
      pfVar6 = (this->ext_params_).
               super__Vector_base<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (uVar4 - 8);
      if (uVar4 < 8) {
        pfVar6 = this->parameters_ + uVar4;
      }
      pvVar7 = pfVar6->pointer_;
      pcVar5 = pfVar6->writer_;
    }
    else {
      pcVar5 = details::formattible<wchar_t>::void_write;
      pvVar7 = (void *)0x0;
    }
    (*pcVar5)((stream_type *)guard._8_8_,pvVar7);
    if ((char)guard.fmt_ == '\0') {
      booster::locale::details::format_parser::restore();
      guard.fmt_._0_1_ = '\x01';
    }
    uVar9 = uVar9 + 1;
  }
  else {
    if (pwVar1[uVar9] == L',') {
      uVar9 = uVar9 + 1;
      bVar2 = true;
      goto LAB_001872c5;
    }
    if ((char)guard.fmt_ == '\0') {
      booster::locale::details::format_parser::restore();
      guard.fmt_._0_1_ = '\x01';
    }
  }
  bVar2 = false;
LAB_001872c5:
  if ((size_type *)svalue.field_2._8_8_ != &value._M_string_length) {
    operator_delete((void *)svalue.field_2._8_8_);
  }
  if (local_c0 != &svalue._M_string_length) {
    operator_delete(local_c0);
  }
  if (local_70 != (undefined1  [8])&key._M_string_length) {
    operator_delete((void *)local_70);
  }
  if (!bVar2) goto LAB_0018732d;
  goto LAB_00187108;
LAB_001871a3:
  if (pwVar1[uVar9] != L'\'') {
    if (pwVar1[uVar9] == L'\0') goto LAB_00187315;
    lVar10 = 1;
    std::__cxx11::wstring::push_back((int)&svalue + L'\x18');
LAB_001871ec:
    uVar9 = uVar9 + lVar10;
    goto LAB_001871a3;
  }
  if (pwVar1[uVar9 + 1] == L'\'') {
    lVar10 = 2;
    std::__cxx11::wstring::push_back((int)&svalue + L'\x18');
    goto LAB_001871ec;
  }
  uVar9 = uVar9 + 1;
LAB_00187315:
  details::format_parser::set_flag_with_str<wchar_t>
            ((format_parser *)((long)&value.field_2 + 8),(string *)local_70,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&svalue.field_2 + 8));
  goto LAB_0018722b;
LAB_0018732d:
  format_guard::~format_guard((format_guard *)local_48);
  booster::locale::details::format_parser::~format_parser
            ((format_parser *)((long)&value.field_2 + 8));
  uVar8 = uVar9;
  goto LAB_0018706d;
}

Assistant:

void format_output(stream_type &out,string_type const &sformat) const
            {
                char_type obrk='{';
                char_type cbrk='}';
                char_type eq='=';
                char_type comma=',';
                char_type quote='\'';

                size_t pos = 0;
                size_t size=sformat.size();
                CharType const *format=sformat.c_str();
                while(format[pos]!=0) {
                    if(format[pos] != obrk) {
                        if(format[pos]==cbrk && format[pos+1]==cbrk) {
                            out << cbrk;
                            pos+=2;
                        }
                        else {
                            out<<format[pos];
                            pos++;
                        }
                        continue;
                    }

                    if(pos+1 < size && format[pos+1]==obrk) {
                        out << obrk;
                        pos+=2;
                        continue;
                    }
                    pos++;
                  
                    details::format_parser fmt(out,static_cast<void *>(&out),&basic_format::imbue_locale);

                    format_guard guard(fmt);

                    while(pos < size) { 
                        std::string key;
                        std::string svalue;
                        string_type value;
                        bool use_svalue = true;
                        for(;format[pos];pos++) {
                            char_type c=format[pos];
                            if(c==comma || c==eq || c==cbrk)
                                break;
                            else {
                                key+=static_cast<char>(c);
                            }
                        }

                        if(format[pos]==eq) {
                            pos++;
                            if(format[pos]==quote) {
                                pos++;
                                use_svalue = false;
                                while(format[pos]) {
                                    if(format[pos]==quote) {
                                        if(format[pos+1]==quote) {
                                            value+=quote;
                                            pos+=2;
                                        }
                                        else {
                                            pos++;
                                            break;
                                        }
                                    }
                                    else {
                                        value+=format[pos];
                                        pos++;
                                    }
                                }
                            }
                            else {
                                char_type c;
                                while((c=format[pos])!=0 && c!=comma && c!=cbrk) {
                                    svalue+=static_cast<char>(c);
                                    pos++;
                                }
                            }
                        }

                        if(use_svalue) {
                            fmt.set_one_flag(key,svalue);
                        }
                        else 
                            fmt.set_flag_with_str(key,value);
                        
                        if(format[pos]==comma) {
                            pos++;
                            continue;
                        }
                        else if(format[pos]==cbrk)  {
                            unsigned position = fmt.get_position();
                            out << get(position);
                            guard.restore();
                            pos++;
                            break;
                        }
                        else {                        
                            guard.restore();
                            break;
                        }
                    }
                }
            }